

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O2

bool __thiscall CMU462::BSDF::refract(BSDF *this,Vector3D *wo,Vector3D *wi,float ior)

{
  return true;
}

Assistant:

bool BSDF::refract(const Vector3D& wo, Vector3D* wi, float ior) {

    // TODO:
    // Use Snell's Law to refract wo surface and store result ray in wi.
    // Return false if refraction does not occur due to total internal reflection
    // and true otherwise. When dot(wo,n) is positive, then wo corresponds to a
    // ray entering the surface through vacuum.

    return true;

  }